

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_rcbuf.c
# Opt level: O1

int nghttp2_rcbuf_new2(nghttp2_rcbuf **rcbuf_ptr,uint8_t *src,size_t srclen,nghttp2_mem *mem)

{
  nghttp2_rcbuf *pnVar1;
  int iVar2;
  uint8_t *puVar3;
  
  iVar2 = nghttp2_rcbuf_new(rcbuf_ptr,srclen + 1,mem);
  if (iVar2 == 0) {
    pnVar1 = *rcbuf_ptr;
    pnVar1->len = srclen;
    puVar3 = nghttp2_cpymem(pnVar1->base,src,srclen);
    *puVar3 = '\0';
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int nghttp2_rcbuf_new2(nghttp2_rcbuf **rcbuf_ptr, const uint8_t *src,
                       size_t srclen, nghttp2_mem *mem) {
  int rv;

  rv = nghttp2_rcbuf_new(rcbuf_ptr, srclen + 1, mem);
  if (rv != 0) {
    return rv;
  }

  (*rcbuf_ptr)->len = srclen;
  *nghttp2_cpymem((*rcbuf_ptr)->base, src, srclen) = '\0';

  return 0;
}